

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O3

int trico_read_ply(uint32_t *nr_of_vertices,float **vertices,float **vertex_normals,
                  uint32_t **vertex_colors,uint32_t *nr_of_triangles,uint32_t **triangles,
                  float **texcoords,char *filename)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t **ppuVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  p_ply ply;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  uint32_t *__s;
  ulong uVar12;
  uint8_t *p_alpha;
  uint8_t *p_blue;
  uint8_t *p_green;
  uint8_t *p_red;
  uint32_t *p_tria_index;
  float *p_vertex_pointer_z;
  float *p_uv;
  float *p_normal_pointer_z;
  float *p_normal_pointer_y;
  float *p_normal_pointer_x;
  float *p_vertex_pointer_y;
  float *p_vertex_pointer_x;
  long local_a8;
  long local_a0;
  uint32_t *local_98;
  uint32_t **local_90;
  uint32_t **local_88;
  long local_80;
  uint32_t *local_78;
  uint32_t *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  *nr_of_vertices = 0;
  *vertices = (float *)0x0;
  *vertex_normals = (float *)0x0;
  *vertex_colors = (uint32_t *)0x0;
  *nr_of_triangles = 0;
  *triangles = (uint32_t *)0x0;
  *texcoords = (float *)0x0;
  local_88 = vertex_colors;
  ply = ply_open(filename,(p_ply_error_cb)0x0,0,(void *)0x0);
  if (ply == (p_ply)0x0) {
    return 0;
  }
  iVar4 = ply_read_header(ply);
  if (iVar4 == 0) {
    return 0;
  }
  local_38 = (float *)0x0;
  local_40 = (float *)0x0;
  local_68 = (float *)0x0;
  local_98 = nr_of_triangles;
  local_90 = triangles;
  lVar7 = ply_set_read_cb(ply,"vertex","x",read_vec3_coord,&local_38,0);
  lVar8 = ply_set_read_cb(ply,"vertex","y",read_vec3_coord,&local_40,0);
  lVar9 = ply_set_read_cb(ply,"vertex","z",read_vec3_coord,&local_68,0);
  if ((lVar7 != lVar8) || (lVar7 != lVar9)) {
    ply_close(ply);
    return 0;
  }
  *nr_of_vertices = (uint32_t)lVar7;
  if (lVar7 < 1) {
    local_38 = *vertices;
  }
  else {
    local_38 = (float *)malloc(lVar7 * 0xc & 0x3fffffffc);
    *vertices = local_38;
  }
  local_40 = local_38 + 1;
  local_68 = local_38 + 2;
  local_48 = (float *)0x0;
  local_50 = (float *)0x0;
  local_58 = (float *)0x0;
  lVar7 = ply_set_read_cb(ply,"vertex","nx",read_vec3_coord,&local_48,0);
  lVar8 = ply_set_read_cb(ply,"vertex","ny",read_vec3_coord,&local_50,0);
  lVar9 = ply_set_read_cb(ply,"vertex","nz",read_vec3_coord,&local_58,0);
  if ((lVar7 != lVar8) || (lVar7 != lVar9)) {
    uVar5 = *nr_of_vertices;
LAB_00113214:
    if (uVar5 == 0) goto LAB_00113232;
    free(*vertices);
    *vertices = (float *)0x0;
LAB_0011322b:
    *nr_of_vertices = 0;
LAB_00113232:
    ply_close(ply);
    return 0;
  }
  if (lVar7 != 0) {
    uVar5 = *nr_of_vertices;
    if (uVar5 != (uint32_t)lVar7) goto LAB_00113214;
    if (0 < lVar7) {
      pfVar10 = (float *)malloc(lVar7 * 0xc & 0x3fffffffc);
      *vertex_normals = pfVar10;
    }
  }
  local_48 = *vertex_normals;
  local_50 = local_48 + 1;
  local_58 = local_48 + 2;
  local_78 = (uint32_t *)0x0;
  local_80 = 0;
  local_a0 = 0;
  local_a8 = 0;
  lVar7 = ply_set_read_cb(ply,"vertex","red",read_color,&local_78,0);
  lVar8 = ply_set_read_cb(ply,"vertex","green",read_color,&local_80,0);
  lVar9 = ply_set_read_cb(ply,"vertex","blue",read_color,&local_a0,0);
  lVar11 = ply_set_read_cb(ply,"vertex","alpha",read_color,&local_a8,0);
  if (lVar7 == 0) {
    lVar7 = ply_set_read_cb(ply,"vertex","r",read_color,&local_78,0);
  }
  if (lVar8 == 0) {
    lVar8 = ply_set_read_cb(ply,"vertex","g",read_color,&local_80,0);
  }
  if (lVar9 == 0) {
    lVar9 = ply_set_read_cb(ply,"vertex","b",read_color,&local_a0,0);
  }
  if (lVar11 == 0) {
    lVar11 = ply_set_read_cb(ply,"vertex","a",read_color,&local_a8,0);
  }
  if (lVar7 == 0) {
    lVar7 = ply_set_read_cb(ply,"vertex","diffuse_red",read_color,&local_78,0);
  }
  if (lVar8 == 0) {
    lVar8 = ply_set_read_cb(ply,"vertex","diffuse_green",read_color,&local_80,0);
  }
  if (lVar9 == 0) {
    lVar9 = ply_set_read_cb(ply,"vertex","diffuse_blue",read_color,&local_a0,0);
  }
  if (lVar11 == 0) {
    lVar11 = ply_set_read_cb(ply,"vertex","diffuse_alpha",read_color,&local_a8,0);
  }
  if ((lVar11 < 1 && lVar9 < 1) && (lVar8 < 1 && lVar7 < 1)) {
    __s = *local_88;
  }
  else {
    uVar1 = *nr_of_vertices;
    uVar12 = (ulong)uVar1;
    if ((((uVar1 != (uint)lVar7 && lVar7 != 0) || (uVar1 != (uint)lVar8 && lVar8 != 0)) ||
        (uVar1 != (uint)lVar9 && lVar9 != 0)) || (uVar1 != (uint)lVar11 && lVar11 != 0)) {
      if (uVar12 == 0) goto LAB_00113232;
      free(*vertices);
      free(*vertex_normals);
      *vertices = (float *)0x0;
      *vertex_normals = (float *)0x0;
      goto LAB_0011322b;
    }
    __s = (uint32_t *)malloc(uVar12 * 4);
    *local_88 = __s;
    if (uVar12 != 0) {
      memset(__s,0xff,uVar12 * 4);
    }
  }
  puVar2 = local_98;
  local_80 = (long)__s + 1;
  local_a0 = (long)__s + 2;
  local_a8 = (long)__s + 3;
  local_70 = (uint32_t *)0x0;
  local_78 = __s;
  lVar7 = ply_set_read_cb(ply,"face","vertex_indices",read_face,&local_70,0);
  if (lVar7 == 0) {
    lVar7 = ply_set_read_cb(ply,"face","vertex_index",read_face,&local_70,0);
  }
  *puVar2 = (uint32_t)lVar7;
  if (lVar7 < 1) {
    local_70 = *local_90;
  }
  else {
    local_70 = (uint32_t *)malloc(lVar7 * 0xc & 0x3fffffffc);
    *local_90 = local_70;
  }
  local_60 = (float *)0x0;
  lVar7 = ply_set_read_cb(ply,"face","texcoord",read_texcoord,&local_60,0);
  if (lVar7 != 0) {
    uVar5 = *puVar2;
    if (uVar5 != (uint32_t)lVar7) {
      if (*nr_of_vertices != 0) {
        free(*vertices);
        free(*vertex_normals);
        ppuVar3 = local_88;
        free(*local_88);
        *vertices = (float *)0x0;
        *vertex_normals = (float *)0x0;
        *ppuVar3 = (uint32_t *)0x0;
        *nr_of_vertices = 0;
        uVar5 = *puVar2;
      }
      ppuVar3 = local_90;
      iVar4 = 0;
      if (uVar5 != 0) {
        free(*local_90);
        *ppuVar3 = (uint32_t *)0x0;
        *puVar2 = 0;
        iVar4 = 0;
      }
      goto LAB_00113434;
    }
    if (0 < lVar7) {
      pfVar10 = (float *)malloc(lVar7 * 0x18 & 0x3fffffff8);
      *texcoords = pfVar10;
    }
  }
  local_60 = *texcoords;
  iVar6 = ply_read(ply);
  iVar4 = 1;
  if (iVar6 == 0) {
    return 0;
  }
LAB_00113434:
  ply_close(ply);
  return iVar4;
}

Assistant:

int trico_read_ply(uint32_t* nr_of_vertices,
  float** vertices,
  float** vertex_normals,
  uint32_t** vertex_colors,
  uint32_t* nr_of_triangles,
  uint32_t** triangles,
  float** texcoords,
  const char* filename)
  {
  *nr_of_vertices = 0;
  *vertices = NULL;
  *vertex_normals = NULL;
  *vertex_colors = NULL;
  *nr_of_triangles = 0;
  *triangles = NULL;
  *texcoords = NULL;

  p_ply ply = ply_open(filename, NULL, 0, NULL);
  if (!ply)
    return 0;
  if (!ply_read_header(ply))
    return 0;

  float* p_vertex_pointer_x = NULL;
  float* p_vertex_pointer_y = NULL;
  float* p_vertex_pointer_z = NULL;

  long nvertices_x = ply_set_read_cb(ply, "vertex", "x", read_vec3_coord, (void*)(&p_vertex_pointer_x), 0);
  long nvertices_y = ply_set_read_cb(ply, "vertex", "y", read_vec3_coord, (void*)(&p_vertex_pointer_y), 0);
  long nvertices_z = ply_set_read_cb(ply, "vertex", "z", read_vec3_coord, (void*)(&p_vertex_pointer_z), 0);

  if ((nvertices_x != nvertices_y) || (nvertices_x != nvertices_z))
    {
    ply_close(ply);
    return 0;
    }

  *nr_of_vertices = (uint32_t)nvertices_x;

  if (nvertices_x > 0)
    *vertices = (float*)trico_malloc(*nr_of_vertices * 3 * sizeof(float));
  p_vertex_pointer_x = (float*)(*vertices);
  p_vertex_pointer_y = p_vertex_pointer_x + 1;
  p_vertex_pointer_z = p_vertex_pointer_x + 2;

  float* p_normal_pointer_x = NULL;
  float* p_normal_pointer_y = NULL;
  float* p_normal_pointer_z = NULL;

  long nnormals_x = ply_set_read_cb(ply, "vertex", "nx", read_vec3_coord, (void*)(&p_normal_pointer_x), 0);
  long nnormals_y = ply_set_read_cb(ply, "vertex", "ny", read_vec3_coord, (void*)(&p_normal_pointer_y), 0);
  long nnormals_z = ply_set_read_cb(ply, "vertex", "nz", read_vec3_coord, (void*)(&p_normal_pointer_z), 0);

  if ((nnormals_x != nnormals_y) || (nnormals_x != nnormals_z) || (nnormals_x && ((uint32_t)nnormals_x != *nr_of_vertices)))
    {
    if (*nr_of_vertices)
      {
      free(*vertices);
      *vertices = NULL;
      *nr_of_vertices = 0;
      }
    ply_close(ply);
    return 0;
    }

  if (nnormals_x > 0)
    *vertex_normals = (float*)trico_malloc(*nr_of_vertices * 3 * sizeof(float));
  p_normal_pointer_x = (float*)(*vertex_normals);
  p_normal_pointer_y = p_normal_pointer_x + 1;
  p_normal_pointer_z = p_normal_pointer_x + 2;

  uint8_t* p_red = NULL;
  uint8_t* p_green = NULL;
  uint8_t* p_blue = NULL;
  uint8_t* p_alpha = NULL;

  long nred = ply_set_read_cb(ply, "vertex", "red", read_color, (void*)(&p_red), 0);
  long ngreen = ply_set_read_cb(ply, "vertex", "green", read_color, (void*)(&p_green), 0);
  long nblue = ply_set_read_cb(ply, "vertex", "blue", read_color, (void*)(&p_blue), 0);
  long nalpha = ply_set_read_cb(ply, "vertex", "alpha", read_color, (void*)(&p_alpha), 0);

  if (nred == 0)
    nred = ply_set_read_cb(ply, "vertex", "r", read_color, (void*)(&p_red), 0);
  if (ngreen == 0)
    ngreen = ply_set_read_cb(ply, "vertex", "g", read_color, (void*)(&p_green), 0);
  if (nblue == 0)
    nblue = ply_set_read_cb(ply, "vertex", "b", read_color, (void*)(&p_blue), 0);
  if (nalpha == 0)
    nalpha = ply_set_read_cb(ply, "vertex", "a", read_color, (void*)(&p_alpha), 0);

  if (nred == 0)
    nred = ply_set_read_cb(ply, "vertex", "diffuse_red", read_color, (void*)(&p_red), 0);
  if (ngreen == 0)
    ngreen = ply_set_read_cb(ply, "vertex", "diffuse_green", read_color, (void*)(&p_green), 0);
  if (nblue == 0)
    nblue = ply_set_read_cb(ply, "vertex", "diffuse_blue", read_color, (void*)(&p_blue), 0);
  if (nalpha == 0)
    nalpha = ply_set_read_cb(ply, "vertex", "diffuse_alpha", read_color, (void*)(&p_alpha), 0);

  if (nred > 0 || ngreen > 0 || nblue > 0 || nalpha > 0)
    {
    if ((nred && ((uint32_t)nred != *nr_of_vertices)) || (ngreen && ((uint32_t)ngreen != *nr_of_vertices)) || (nblue && ((uint32_t)nblue != *nr_of_vertices)) || (nalpha && ((uint32_t)nalpha != *nr_of_vertices)))
      {
      if (*nr_of_vertices)
        {
        free(*vertices);
        free(*vertex_normals);
        *vertices = NULL;
        *vertex_normals = NULL;
        *nr_of_vertices = 0;
        }
      ply_close(ply);
      return 0;
      }
    *vertex_colors = (uint32_t*)trico_malloc(*nr_of_vertices * sizeof(uint32_t));
    uint32_t* p_clr = *vertex_colors;
    for (uint32_t c = 0; c < *nr_of_vertices; ++c)
      *p_clr++ = 0xffffffff;
    }

  p_red = (uint8_t*)(*vertex_colors);
  p_green = p_red + 1;
  p_blue = p_red + 2;
  p_alpha = p_red + 3;

  uint32_t* p_tria_index = NULL;

  long ntriangles = ply_set_read_cb(ply, "face", "vertex_indices", read_face, (void*)(&p_tria_index), 0);
  if (ntriangles == 0)
    ntriangles = ply_set_read_cb(ply, "face", "vertex_index", read_face, (void*)(&p_tria_index), 0);

  *nr_of_triangles = (uint32_t)ntriangles;

  if (ntriangles > 0)
    *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));

  p_tria_index = (uint32_t*)(*triangles);

  float* p_uv = NULL;

  long ntexcoords = ply_set_read_cb(ply, "face", "texcoord", read_texcoord, (void*)(&p_uv), 0);

  if (ntexcoords && ((uint32_t)ntexcoords != *nr_of_triangles))
    {
    if (*nr_of_vertices)
      {
      free(*vertices);
      free(*vertex_normals);
      free(*vertex_colors);
      *vertices = NULL;
      *vertex_normals = NULL;
      *vertex_colors = NULL;
      *nr_of_vertices = 0;
      }
    if (*nr_of_triangles)
      {
      free(*triangles);
      *triangles = NULL;
      *nr_of_triangles = 0;
      }
    ply_close(ply);
    return 0;
    }

  if (ntexcoords > 0)
    *texcoords = (float*)trico_malloc(*nr_of_triangles * 6 * sizeof(float));

  p_uv = (float*)(*texcoords);

  if (!ply_read(ply))
    return 0;

  ply_close(ply);

  return 1;
  }